

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void fs_emit_error(void)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  long *extraout_RDX;
  string local_40 [32];
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar1 != 0) {
    plVar4 = (long *)std::_V2::generic_category();
    uVar2 = (**(code **)(*plVar4 + 0x28))(plVar4,iVar1);
    poVar5 = std::operator<<((ostream *)&std::cerr,"errno:");
    (**(code **)(*extraout_RDX + 0x20))(local_40,extraout_RDX,uVar2);
    poVar5 = std::operator<<(poVar5,local_40);
    std::operator<<(poVar5," ");
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

static void fs_emit_error()
{
#if defined(_WIN32) || defined(__CYGWIN__)
  if (DWORD error = GetLastError(); error)
    std::cerr << "GetLastError:" << std::system_category().message(error) << " ";
#else
  if(errno){
    auto econd = std::generic_category().default_error_condition(errno);
    std::cerr << "errno:" << econd.message() << " ";
  }
#endif
}